

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgm_tree_index_impl.h
# Opt level: O0

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
ted_ub::LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>::
fill_gaps_in_mapping
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,
          LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this,
          TreeIndexLGM *t1,TreeIndexLGM *t2,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *mapping,int k)

{
  allocator<int> *paVar1;
  int iVar2;
  bool bVar3;
  reference __p;
  reference pvVar4;
  int local_134;
  int local_130;
  int i_missing;
  int j_missing;
  pair<int,_int> local_124;
  byte local_119;
  int local_118;
  int iStack_114;
  bool mapped_in_gap;
  int j_last;
  int j;
  int i_last;
  int i;
  int not_mapped_second;
  int not_mapped_first;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_f8;
  iterator end_gap_it;
  int local_e8;
  pair<int,_int> end_gap;
  pair<int,_int> local_dc;
  pair<int,_int> begin_gap;
  allocator<int> local_c9;
  undefined1 local_c8 [8];
  vector<int,_std::allocator<int>_> t2_count_mapped_anc;
  undefined1 local_a8 [8];
  vector<int,_std::allocator<int>_> t1_count_mapped_anc;
  undefined1 local_88 [8];
  vector<int,_std::allocator<int>_> t2_count_mapped_desc;
  allocator<int> local_59;
  undefined1 local_58 [8];
  vector<int,_std::allocator<int>_> t1_count_mapped_desc;
  int k_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *mapping_local;
  TreeIndexLGM *t2_local;
  TreeIndexLGM *t1_local;
  LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *result_mapping;
  
  t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._3_1_ = 0;
  t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._4_4_ = k;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (__return_storage_ptr__);
  iVar2 = (t1->super_Constants).tree_size_;
  std::allocator<int>::allocator(&local_59);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_58,(long)iVar2,&local_59);
  std::allocator<int>::~allocator(&local_59);
  iVar2 = (t2->super_Constants).tree_size_;
  paVar1 = (allocator<int> *)
           ((long)&t1_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_88,(long)iVar2,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&t1_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = (t1->super_Constants).tree_size_;
  paVar1 = (allocator<int> *)
           ((long)&t2_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a8,(long)iVar2,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&t2_count_mapped_anc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = (t2->super_Constants).tree_size_;
  std::allocator<int>::allocator(&local_c9);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_c8,(long)iVar2,&local_c9);
  std::allocator<int>::~allocator(&local_c9);
  get_mapped_ancestors_counts
            (this,t1,t2,mapping,(vector<int,_std::allocator<int>_> *)local_a8,
             (vector<int,_std::allocator<int>_> *)local_c8);
  std::pair<int,_int>::pair<int,_int,_true>(&begin_gap,(int *)t1,(int *)t2);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
            (mapping,&begin_gap);
  end_gap.second = -1;
  end_gap.first = -1;
  std::pair<int,_int>::pair<int,_int,_true>(&local_dc,&end_gap.second,&end_gap.first);
  std::pair<int,_int>::pair<int,_int,_true>((pair<int,_int> *)((long)&end_gap_it._M_current + 4));
  local_f8._M_current =
       (pair<int,_int> *)
       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(mapping);
  do {
    while( true ) {
      _not_mapped_second =
           std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(mapping);
      bVar3 = __gnu_cxx::operator!=
                        (&local_f8,
                         (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                          *)&not_mapped_second);
      if (!bVar3) {
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::pop_back
                  (__return_storage_ptr__);
        t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_c8);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_a8);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_88);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_58);
        if ((t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                    (__return_storage_ptr__);
        }
        return __return_storage_ptr__;
      }
      __p = __gnu_cxx::
            __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            ::operator*(&local_f8);
      std::pair<int,_int>::operator=((pair<int,_int> *)((long)&end_gap_it._M_current + 4),__p);
      iVar2 = local_dc.first;
      if ((end_gap_it._M_current._4_4_ - local_dc.first != 1) && (local_e8 - local_dc.second != 1))
      break;
      while (i = iVar2 + 1, i < end_gap_it._M_current._4_4_) {
        update_desc_when_not_mapped
                  (this,i,(vector<int,_std::allocator<int>_> *)local_58,
                   &(t1->super_PostLToParent).postl_to_parent_,(t1->super_Constants).tree_size_);
        iVar2 = i;
      }
      update_desc_when_mapped
                (this,end_gap_it._M_current._4_4_,(vector<int,_std::allocator<int>_> *)local_58,
                 &(t1->super_PostLToParent).postl_to_parent_,(t1->super_Constants).tree_size_);
      i_last = local_dc.second;
      while (i_last = i_last + 1, i_last < local_e8) {
        update_desc_when_not_mapped
                  (this,i_last,(vector<int,_std::allocator<int>_> *)local_88,
                   &(t2->super_PostLToParent).postl_to_parent_,(t2->super_Constants).tree_size_);
      }
      update_desc_when_mapped
                (this,local_e8,(vector<int,_std::allocator<int>_> *)local_88,
                 &(t2->super_PostLToParent).postl_to_parent_,(t2->super_Constants).tree_size_);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (__return_storage_ptr__,(value_type *)((long)&end_gap_it._M_current + 4));
      std::pair<int,_int>::operator=(&local_dc,(type)((long)&end_gap_it._M_current + 4));
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&local_f8);
    }
    j = local_dc.first + 1;
    j_last = end_gap_it._M_current._4_4_ + -1;
    iStack_114 = local_dc.second + 1;
    local_118 = local_e8 + -1;
    local_119 = 0;
    while (j <= j_last && iStack_114 <= local_118) {
      (this->super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>
      ).subproblem_counter_ =
           (this->
           super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>).
           subproblem_counter_ + 1;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_58,(long)j);
      iVar2 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_88,(long)iStack_114);
      if (iVar2 == *pvVar4) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_a8,(long)j);
        iVar2 = *pvVar4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_c8,(long)iStack_114);
        if (((iVar2 == *pvVar4) &&
            (bVar3 = k_relevant(this,t1,t2,j,iStack_114,
                                t1_count_mapped_desc.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_), bVar3)) &&
           (bVar3 = if_in_corresponding_regions
                              (this,t1,t2,local_dc.first,j,end_gap_it._M_current._4_4_,
                               local_dc.second,iStack_114,local_e8), bVar3)) {
          update_desc_when_mapped
                    (this,j,(vector<int,_std::allocator<int>_> *)local_58,
                     &(t1->super_PostLToParent).postl_to_parent_,(t1->super_Constants).tree_size_);
          update_desc_when_mapped
                    (this,iStack_114,(vector<int,_std::allocator<int>_> *)local_88,
                     &(t2->super_PostLToParent).postl_to_parent_,(t2->super_Constants).tree_size_);
          std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_124,&j,&stack0xfffffffffffffeec);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                    (__return_storage_ptr__,&local_124);
          std::pair<int,_int>::pair<int_&,_int_&,_true>
                    ((pair<int,_int> *)&i_missing,&j,&stack0xfffffffffffffeec);
          std::pair<int,_int>::operator=(&local_dc,(type)&i_missing);
          local_119 = 1;
          break;
        }
      }
      if (local_118 - iStack_114 < j_last - j) {
        update_desc_when_not_mapped
                  (this,j,(vector<int,_std::allocator<int>_> *)local_58,
                   &(t1->super_PostLToParent).postl_to_parent_,(t1->super_Constants).tree_size_);
        j = j + 1;
      }
      else {
        update_desc_when_not_mapped
                  (this,iStack_114,(vector<int,_std::allocator<int>_> *)local_88,
                   &(t2->super_PostLToParent).postl_to_parent_,(t2->super_Constants).tree_size_);
        iStack_114 = iStack_114 + 1;
      }
    }
    if ((local_119 & 1) == 0) {
      for (local_130 = iStack_114; local_130 <= local_118; local_130 = local_130 + 1) {
        update_desc_when_not_mapped
                  (this,iStack_114,(vector<int,_std::allocator<int>_> *)local_88,
                   &(t2->super_PostLToParent).postl_to_parent_,(t2->super_Constants).tree_size_);
      }
      for (local_134 = j; local_134 <= j_last; local_134 = local_134 + 1) {
        update_desc_when_not_mapped
                  (this,j,(vector<int,_std::allocator<int>_> *)local_58,
                   &(t1->super_PostLToParent).postl_to_parent_,(t1->super_Constants).tree_size_);
      }
      update_desc_when_mapped
                (this,end_gap_it._M_current._4_4_,(vector<int,_std::allocator<int>_> *)local_58,
                 &(t1->super_PostLToParent).postl_to_parent_,(t1->super_Constants).tree_size_);
      update_desc_when_mapped
                (this,local_e8,(vector<int,_std::allocator<int>_> *)local_88,
                 &(t2->super_PostLToParent).postl_to_parent_,(t2->super_Constants).tree_size_);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (__return_storage_ptr__,(value_type *)((long)&end_gap_it._M_current + 4));
      std::pair<int,_int>::operator=(&local_dc,(type)((long)&end_gap_it._M_current + 4));
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&local_f8);
    }
  } while( true );
}

Assistant:

std::vector<std::pair<int, int>> LGMTreeIndex<CostModel, TreeIndex>::fill_gaps_in_mapping(
    const TreeIndex& t1, const TreeIndex& t2,
    std::vector<std::pair<int, int>>& mapping, const int k) {
  
  // In result_mapping we store the output of this function.
  std::vector<std::pair<int, int>> result_mapping;
  
  // The counts for mapped descendants and nodes to the left must be maintained.
  std::vector<int> t1_count_mapped_desc(t1.tree_size_);
  std::vector<int> t2_count_mapped_desc(t2.tree_size_);
    
  // The counts for mapped ancestors.
  std::vector<int> t1_count_mapped_anc(t1.tree_size_);
  std::vector<int> t2_count_mapped_anc(t2.tree_size_);
  get_mapped_ancestors_counts(t1, t2, mapping, t1_count_mapped_anc, t2_count_mapped_anc);
  
  // Add a dummy mapping pair to cover the gap from the last mapping until the
  // ends of the trees.
  mapping.push_back({t1.tree_size_, t2.tree_size_});
  
  std::pair<int, int> begin_gap = {-1, -1};
  std::pair<int, int> end_gap;
  std::vector<std::pair<int, int>>::iterator end_gap_it = mapping.begin();
  
  while (end_gap_it != mapping.end()) {
    end_gap = *end_gap_it;
    // If there is no gap, continue with the next mapped pair.
    if (end_gap.first - begin_gap.first == 1 || end_gap.second - begin_gap.second == 1) {
      // Update the counts for nodes between begin_gap and end_gap, if any,
      // as not-mapped nodes.
      for (int not_mapped_first = begin_gap.first + 1; not_mapped_first < end_gap.first; ++not_mapped_first) {
        update_desc_when_not_mapped(not_mapped_first, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
      }
      // Update the counts for nodes in end_gap as mapped nodes.
      update_desc_when_mapped(end_gap.first, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
      // Update the counts for nodes between begin_gap and end_gap, if any,
      // as not-mapped nodes.
      for (int not_mapped_second = begin_gap.second + 1; not_mapped_second < end_gap.second; ++not_mapped_second) {
        update_desc_when_not_mapped(not_mapped_second, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
      }
      // Update the counts for nodes in end_gap as mapped nodes.
      update_desc_when_mapped(end_gap.second, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
      // Push the end of the current gap to the result.
      result_mapping.push_back(end_gap);
      // Update the begin of the next gap.
      begin_gap = end_gap;
      ++end_gap_it;
      continue;
    }
    // There is a gap --> try to map nodes --> at the first node pair mapped,
    // change the gap and continue the loop.
    int i = begin_gap.first + 1;
    int i_last = end_gap.first - 1;
    int j = begin_gap.second + 1;
    int j_last = end_gap.second - 1;
    bool mapped_in_gap = false;
    while (i <= i_last && j <= j_last) {
      ++subproblem_counter_;
      if (t1_count_mapped_desc[i] == t2_count_mapped_desc[j] &&
          t1_count_mapped_anc[i] == t2_count_mapped_anc[j] &&
          k_relevant(t1, t2, i, j, k) &&
          if_in_corresponding_regions(t1, t2, begin_gap.first, i, end_gap.first, begin_gap.second, j, end_gap.second)) {
        // Map (i,j) + push to result mapping + update counts for both nodes
        // incremented as mapped.
        update_desc_when_mapped(i, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
        update_desc_when_mapped(j, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
        result_mapping.push_back({i, j});
        begin_gap = {i, j};
        mapped_in_gap = true;
        break;
      } else {
        // Update counts for the incremented node as non-mapped.
        if (i_last - i > j_last - j) {
          update_desc_when_not_mapped(i, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
          ++i;
        } else {
          update_desc_when_not_mapped(j, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
          ++j;
        }
      }
    }
    if (mapped_in_gap) {
      continue;
    } else {
      // Check the case when only one of i or j incremented beyond the limit.
      // The gap in one of the trees has been used up.
      // Nothing mapped in the gap.
      for (int j_missing = j; j_missing <= j_last; ++j_missing) {
        update_desc_when_not_mapped(j, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
      }
      for (int i_missing = i; i_missing <= i_last; ++i_missing) {
        update_desc_when_not_mapped(i, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
      }
      // Update the counts for nodes in end_gap as mapped nodes.
      update_desc_when_mapped(end_gap.first, t1_count_mapped_desc, t1.postl_to_parent_, t1.tree_size_);
      update_desc_when_mapped(end_gap.second, t2_count_mapped_desc, t2.postl_to_parent_, t2.tree_size_);
      // Push the end of the current gap to the result.
      result_mapping.push_back(end_gap);
      // Update the begin of the next gap.
      begin_gap = end_gap;
      ++end_gap_it;
      continue;
    }
  }
  // Remove the last dummy mapping.
  result_mapping.pop_back();
  return result_mapping;
}